

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricHeaterType::~IfcElectricHeaterType(IfcElectricHeaterType *this)

{
  ~IfcElectricHeaterType
            ((IfcElectricHeaterType *)
             &this[-1].super_IfcFlowTerminalType.super_IfcDistributionFlowElementType.
              super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcElectricHeaterType() : Object("IfcElectricHeaterType") {}